

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorldCoordinates.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::WorldCoordinates::Encode(WorldCoordinates *this,KDataStream *stream)

{
  KDataStream::Write<double>(stream,(double)this->m_f64X);
  KDataStream::Write<double>(stream,(double)this->m_f64Y);
  KDataStream::Write<double>(stream,(double)this->m_f64Z);
  return;
}

Assistant:

void WorldCoordinates::Encode( KDataStream & stream ) const
{
    stream << m_f64X
           << m_f64Y
           << m_f64Z;
}